

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::TestDeprecatedLite::Clear(TestDeprecatedLite *this)

{
  ulong uVar1;
  TestDeprecatedLite *this_00;
  anon_union_32_1_493b367e_for_TestDeprecatedLite_3 aVar2;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal local_20;
  
  aVar2 = this->field_0;
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x3) != (undefined1  [32])0x0) {
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 8);
      if ((uVar1 & 3) == 0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
        ;
        failure_msg = "!tagged_ptr_.IsDefault()";
        line = 0x20b;
        goto LAB_001df74a;
      }
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      this_00 = (this->field_0)._impl_.deprecated_field4_;
      if (this_00 == (TestDeprecatedLite *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.cc"
        ;
        failure_msg = "_impl_.deprecated_field4_ != nullptr";
        line = 0x1a9e;
LAB_001df74a:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,file,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      Clear(this_00);
    }
  }
  if (((undefined1  [32])aVar2 & (undefined1  [32])0xc) != (undefined1  [32])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestDeprecatedLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestDeprecatedLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.deprecated_field3_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.deprecated_field4_ != nullptr);
      _impl_.deprecated_field4_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000000cu) != 0) {
    ::memset(&_impl_.deprecated_field_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.deprecated_field2_) -
        reinterpret_cast<char*>(&_impl_.deprecated_field_)) + sizeof(_impl_.deprecated_field2_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}